

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  pointer pcVar3;
  cmake *pcVar4;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> this_00;
  char cVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  CURL_conflict *pCVar12;
  long *plVar13;
  long lVar14;
  cmCTestScriptHandler *pcVar15;
  cmValue cVar16;
  unsigned_long uVar17;
  FILE *__stream;
  pointer pcVar18;
  string *psVar19;
  size_type *psVar20;
  undefined8 uVar21;
  char *extraout_RDX;
  char *pcVar22;
  ulong uVar23;
  string *h;
  pointer pbVar24;
  size_t sVar25;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tlsVersionStr;
  string local_file;
  cmCTestSubmitHandlerVectorOfChar chunk;
  string retryCount;
  string upload_as;
  cmCTestCurlOpts curlOpts;
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  string remote_file;
  long response_code;
  ostringstream cmCTestLog_msg;
  string ofile;
  char error_buffer [1024];
  Curl_easy *in_stack_fffffffffffff858;
  undefined1 local_798 [24];
  undefined1 local_780 [8];
  bool local_778;
  char local_759;
  string local_758;
  string local_738;
  void *local_718;
  void *pvStack_710;
  long local_708;
  string local_700;
  CURL_conflict *local_6e0;
  pointer local_6d8;
  curl_slist *local_6d0;
  string local_6c8;
  _Storage<int,_true> local_6a4;
  char local_6a0;
  byte local_69c;
  char local_69b;
  char local_69a;
  void *local_698;
  void *pvStack_690;
  long local_688;
  string local_680;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_660;
  long local_658;
  undefined1 local_650 [8];
  _Optional_payload_base<int> local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_640;
  pointer local_630;
  pointer local_628;
  pointer local_620;
  _Alloc_hider local_618;
  size_type local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  _Alloc_hider local_5f8;
  ios_base local_5e0 [264];
  string local_4d8;
  string *local_4b8;
  string *local_4b0;
  string *local_4a8;
  pointer local_4a0;
  double local_498;
  double local_490;
  cmCTestSubmitHandlerVectorOfChar local_488;
  cmCTestSubmitHandlerVectorOfChar local_470;
  string local_458;
  char local_438 [1032];
  
  local_660 = files;
  local_4b8 = localprefix;
  local_4b0 = url;
  local_4a8 = remoteprefix;
  local_6d0 = curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  pbVar24 = (this->HttpHeaders).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->HttpHeaders).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar24 != pbVar1) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_650,"   Add HTTP Header: \"",0x15);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_650,(pbVar24->_M_dataplus)._M_p,
                           pbVar24->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0xa9,(char *)local_798._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
        operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
      std::ios_base::~ios_base(local_5e0);
      local_6d0 = curl_slist_append(local_6d0,(pbVar24->_M_dataplus)._M_p);
      pbVar24 = pbVar24 + 1;
    } while (pbVar24 != pbVar1);
  }
  curl_global_init(3);
  cmCTestCurlOpts::cmCTestCurlOpts
            ((cmCTestCurlOpts *)&local_6a4,(this->super_cmCTestGenericHandler).CTest);
  local_6d8 = (local_660->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_4a0 = (local_660->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_6d8 != local_4a0) {
    do {
      pCVar12 = curl_easy_init();
      if (pCVar12 != (CURL_conflict *)0x0) {
        local_650 = (undefined1  [8])&local_640;
        local_648._M_payload = (_Storage<int,_true>)0x0;
        local_648._M_engaged = false;
        local_648._5_3_ = 0;
        local_640._M_allocated_capacity = local_640._M_allocated_capacity & 0xffffffffffffff00;
        cmCurlSetCAInfo(&local_458,pCVar12,(string *)local_650);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
        }
        if (local_650 != (undefined1  [8])&local_640) {
          operator_delete((void *)local_650,local_640._M_allocated_capacity + 1);
        }
        if (local_6a0 == '\x01') {
          cmCurlPrintTLSVersion_abi_cxx11_
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_798,local_6a4._M_value);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_650,"  Set CURLOPT_SSLVERSION to ",0x1c);
          local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
          if (local_778 == true) {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_738,local_798._0_8_,
                       (char *)(local_798._8_8_ + local_798._0_8_));
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"unknown value","")
            ;
          }
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_650,local_738._M_dataplus._M_p,
                               local_738._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_738._M_dataplus._M_p != &local_738.field_2) {
            operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
          }
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0xbc,local_738._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_738._M_dataplus._M_p != &local_738.field_2) {
            operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
          std::ios_base::~ios_base(local_5e0);
          curl_easy_setopt(pCVar12,CURLOPT_SSLVERSION,(ulong)(uint)local_6a4._M_value);
          if ((local_778 == true) &&
             (local_778 = false, (undefined1 *)local_798._0_8_ != local_798 + 0x10)) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
        }
        if (local_69b == '\x01') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_650,"  Set CURLOPT_SSL_VERIFYPEER to ",0x20);
          pcVar22 = "off";
          if ((ulong)local_69c != 0) {
            pcVar22 = "on";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_650,pcVar22,(ulong)local_69c ^ 3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_650,"\n",1);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0xc4,(char *)local_798._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
          std::ios_base::~ios_base(local_5e0);
          curl_easy_setopt(pCVar12,CURLOPT_SSL_VERIFYPEER,(ulong)local_69c);
        }
        if (local_69a == '\x01') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_650,"  Set CURLOPT_SSL_VERIFYHOST to off\n",0x24);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0xcb,(char *)local_798._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
          std::ios_base::~ios_base(local_5e0);
          curl_easy_setopt(pCVar12,CURLOPT_SSL_VERIFYHOST,0);
        }
        if (0 < this->HTTPProxyType) {
          curl_easy_setopt(pCVar12,CURLOPT_PROXY,(this->HTTPProxy)._M_dataplus._M_p);
          if (this->HTTPProxyType == 3) {
            uVar21 = 5;
          }
          else {
            if (this->HTTPProxyType != 2) {
              curl_easy_setopt(pCVar12,CURLOPT_PROXYTYPE,0);
              if ((this->HTTPProxyAuth)._M_string_length != 0) {
                curl_easy_setopt(pCVar12,CURLOPT_PROXYUSERPWD,(this->HTTPProxyAuth)._M_dataplus._M_p
                                );
              }
              goto LAB_002b0d22;
            }
            uVar21 = 4;
          }
          curl_easy_setopt(pCVar12,CURLOPT_PROXYTYPE,uVar21);
        }
LAB_002b0d22:
        bVar7 = cmCTest::ShouldUseHTTP10((this->super_cmCTestGenericHandler).CTest);
        if (bVar7) {
          curl_easy_setopt(pCVar12,CURLOPT_HTTP_VERSION,1);
        }
        curl_easy_setopt(pCVar12,CURLOPT_UPLOAD,1);
        curl_easy_setopt(pCVar12,CURLOPT_LOW_SPEED_LIMIT,1);
        uVar8 = GetSubmitInactivityTimeout(this);
        if (uVar8 != 0) {
          curl_easy_setopt(pCVar12,CURLOPT_LOW_SPEED_TIME,(ulong)uVar8);
        }
        curl_easy_setopt(pCVar12,CURLOPT_VERBOSE,1);
        curl_easy_setopt(pCVar12,CURLOPT_HTTPHEADER,local_6d0);
        local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
        pcVar3 = (local_6d8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_738,pcVar3,pcVar3 + local_6d8->_M_string_length);
        bVar7 = cmsys::SystemTools::FileExists(&local_738);
        if (!bVar7) {
          local_648 = (_Optional_payload_base<int>)(local_4b8->_M_dataplus)._M_p;
          local_650 = (undefined1  [8])local_4b8->_M_string_length;
          local_640._M_allocated_capacity = 0;
          local_640._8_8_ = 1;
          local_630 = (pointer)0x9ca0f9;
          local_628 = (pointer)0x0;
          local_618._M_p = (local_6d8->_M_dataplus)._M_p;
          local_620 = (pointer)local_6d8->_M_string_length;
          local_610 = 0;
          views._M_len = 3;
          views._M_array = (iterator)local_650;
          cmCatViews((string *)local_798,views);
          std::__cxx11::string::operator=((string *)&local_738,(string *)local_798);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
        }
        cmsys::SystemTools::GetFilenameName((string *)local_650,local_6d8);
        plVar13 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_650,0,(char *)0x0,
                                     (ulong)(local_4a8->_M_dataplus)._M_p);
        local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
        psVar20 = (size_type *)(plVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar20) {
          local_680.field_2._M_allocated_capacity = *psVar20;
          local_680.field_2._8_8_ = plVar13[3];
        }
        else {
          local_680.field_2._M_allocated_capacity = *psVar20;
          local_680._M_dataplus._M_p = (pointer)*plVar13;
        }
        local_680._M_string_length = plVar13[1];
        *plVar13 = (long)psVar20;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        if (local_650 != (undefined1  [8])&local_640) {
          operator_delete((void *)local_650,local_640._M_allocated_capacity + 1);
        }
        poVar11 = this->LogFile;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\tUpload file: ",0xe);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_738._M_dataplus._M_p,local_738._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," to ",4);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_680._M_dataplus._M_p,local_680._M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        cmSystemTools::EncodeURL(&local_4d8,&local_680,true);
        psVar19 = local_4b0;
        lVar14 = std::__cxx11::string::find((char)local_4b0,0x3f);
        local_780[0] = '&';
        if (lVar14 == -1) {
          local_780[0] = '?';
        }
        local_648 = (_Optional_payload_base<int>)(psVar19->_M_dataplus)._M_p;
        local_650 = (undefined1  [8])psVar19->_M_string_length;
        local_640._M_allocated_capacity = 0;
        local_798._0_8_ = (pointer)0x0;
        local_798._8_8_ = 1;
        local_798._16_8_ = local_780;
        local_640._8_8_ = 1;
        local_628 = (pointer)0x0;
        local_620 = (pointer)&DAT_00000009;
        local_618._M_p = "FileName=";
        local_610 = 0;
        local_608._M_allocated_capacity = local_4d8._M_string_length;
        local_608._8_8_ = local_4d8._M_dataplus._M_p;
        local_5f8._M_p = (pointer)0x0;
        views_00._M_len = 4;
        views_00._M_array = (iterator)local_650;
        local_630 = (pointer)local_798._16_8_;
        cmCatViews(&local_6c8,views_00);
        if (!bVar7) {
          cmCTestCurl::cmCTestCurl
                    ((cmCTestCurl *)local_650,(this->super_cmCTestGenericHandler).CTest);
          std::__cxx11::string::append((char *)&local_6c8);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"BuildName","");
          cmCTest::GetCTestConfiguration(&local_700,pcVar2,&local_758);
          cmCTestCurl::Escape((string *)local_798,(cmCTestCurl *)local_650,&local_700);
          std::__cxx11::string::_M_append((char *)&local_6c8,local_798._0_8_);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_dataplus._M_p != &local_700.field_2) {
            operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_758._M_dataplus._M_p != &local_758.field_2) {
            operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_6c8);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"Site","");
          cmCTest::GetCTestConfiguration(&local_700,pcVar2,&local_758);
          cmCTestCurl::Escape((string *)local_798,(cmCTestCurl *)local_650,&local_700);
          std::__cxx11::string::_M_append((char *)&local_6c8,local_798._0_8_);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_dataplus._M_p != &local_700.field_2) {
            operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_758._M_dataplus._M_p != &local_758.field_2) {
            operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_6c8);
          cmCTest::GetCurrentTag_abi_cxx11_(&local_700,(this->super_cmCTestGenericHandler).CTest);
          cmCTestCurl::Escape((string *)local_798,(cmCTestCurl *)local_650,&local_700);
          std::__cxx11::string::_M_append((char *)&local_6c8,local_798._0_8_);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_dataplus._M_p != &local_700.field_2) {
            operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_6c8);
          cmCTest::GetTestModelString_abi_cxx11_
                    (&local_700,(this->super_cmCTestGenericHandler).CTest);
          cmCTestCurl::Escape((string *)local_798,(cmCTestCurl *)local_650,&local_700);
          std::__cxx11::string::_M_append((char *)&local_6c8,local_798._0_8_);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_dataplus._M_p != &local_700.field_2) {
            operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
          }
          pcVar15 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
          pcVar4 = (pcVar15->CMake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
                   _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                   super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
          if (pcVar4 != (cmake *)0x0) {
            this_00.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
                 (pcVar4->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
            local_798._0_8_ = local_798 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_798,"SubProject","");
            cVar16 = cmState::GetGlobalProperty
                               ((cmState *)
                                this_00.
                                super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                super__Head_base<0UL,_cmState_*,_false>._M_head_impl,
                                (string *)local_798);
            if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
              operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
            }
            if (cVar16.Value != (string *)0x0) {
              std::__cxx11::string::append((char *)&local_6c8);
              cmCTestCurl::Escape((string *)local_798,(cmCTestCurl *)local_650,cVar16.Value);
              std::__cxx11::string::_M_append((char *)&local_6c8,local_798._0_8_);
              if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
                operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
              }
            }
          }
          cmCTestCurl::~cmCTestCurl((cmCTestCurl *)local_650);
        }
        local_6e0 = pCVar12;
        iVar9 = std::__cxx11::string::compare((char *)local_6d8);
        if (iVar9 == 0) {
          cmCTest::GenerateDoneFile((this->super_cmCTestGenericHandler).CTest);
        }
        std::__cxx11::string::append((char *)&local_6c8);
        local_650 = (undefined1  [8])&local_640;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_650,"InternalTest","");
        cVar16 = cmCTestGenericHandler::GetOption
                           (&this->super_cmCTestGenericHandler,(string *)local_650);
        if (cVar16.Value == (string *)0x0) {
          bVar7 = false;
        }
        else {
          value._M_str = extraout_RDX;
          value._M_len = (size_t)((cVar16.Value)->_M_dataplus)._M_p;
          bVar7 = cmValue::IsOn((cmValue *)(cVar16.Value)->_M_string_length,value);
        }
        if (local_650 != (undefined1  [8])&local_640) {
          operator_delete((void *)local_650,local_640._M_allocated_capacity + 1);
        }
        if (bVar7 == false) {
          cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_798,AlgoMD5);
          cmCryptoHash::HashFile((string *)local_650,(cmCryptoHash *)local_798,&local_738);
          std::__cxx11::string::_M_append((char *)&local_6c8,(ulong)local_650);
          if (local_650 != (undefined1  [8])&local_640) {
            operator_delete((void *)local_650,local_640._M_allocated_capacity + 1);
          }
          cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_798);
        }
        else {
          std::__cxx11::string::append((char *)&local_6c8);
        }
        bVar7 = cmsys::SystemTools::FileExists(&local_738);
        if (!bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_650,"   Cannot find file: ",0x15);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_650,local_738._M_dataplus._M_p,
                               local_738._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x135,(char *)local_798._0_8_,false);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
          std::ios_base::~ios_base(local_5e0);
          curl_easy_cleanup(in_stack_fffffffffffff858);
          curl_slist_free_all(local_6d0);
          curl_global_cleanup();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
            operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_680._M_dataplus._M_p != &local_680.field_2) {
            operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_738._M_dataplus._M_p == &local_738.field_2) {
            return false;
          }
          operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
          return false;
        }
        uVar17 = cmsys::SystemTools::FileLength(&local_738);
        __stream = (FILE *)cmsys::SystemTools::Fopen(&local_738,"rb");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_650,"   Upload file: ",0x10);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_650,local_738._M_dataplus._M_p,
                             local_738._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," to ",4);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_6c8._M_dataplus._M_p,local_6c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," Size: ",7);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x142,(char *)local_798._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
          operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
        std::ios_base::~ios_base(local_5e0);
        pCVar12 = local_6e0;
        curl_easy_setopt(local_6e0,CURLOPT_URL,local_6c8._M_dataplus._M_p);
        curl_easy_setopt(pCVar12,CURLOPT_FOLLOWLOCATION,1);
        curl_easy_setopt(pCVar12,CURLOPT_HTTPAUTH,0xffffffffffffffef);
        curl_easy_setopt(pCVar12,CURLOPT_READDATA,__stream);
        curl_easy_setopt(pCVar12,CURLOPT_INFILESIZE,uVar17);
        curl_easy_setopt(pCVar12,CURLOPT_ERRORBUFFER,local_438);
        curl_easy_setopt(pCVar12,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
        curl_easy_setopt(pCVar12,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
        local_718 = (void *)0x0;
        pvStack_710 = (void *)0x0;
        local_708 = 0;
        local_688 = 0;
        local_698 = (void *)0x0;
        pvStack_690 = (void *)0x0;
        curl_easy_setopt(pCVar12,CURLOPT_WRITEDATA,&local_718);
        curl_easy_setopt(pCVar12,CURLOPT_DEBUGDATA,&local_698);
        curl_easy_perform(pCVar12);
        cVar5 = (char)(cmCTestCurl *)local_650;
        if (local_718 != pvStack_710) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_650,"CURL output: [",0xe);
          if (pvStack_710 != local_718) {
            std::ostream::write((char *)local_650,(long)local_718);
            std::ostream::flush();
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_650,"]",1);
          std::ios::widen((char)*(undefined8 *)((long)local_650 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x16b,(char *)local_798._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
          std::ios_base::~ios_base(local_5e0);
          uVar23 = (long)pvStack_710 - (long)local_718;
          if (uVar23 == 0) {
            pcVar18 = (pointer)0x0;
            sVar25 = 0;
          }
          else {
            if ((long)uVar23 < 0) {
              std::__throw_bad_alloc();
            }
            pcVar18 = (pointer)operator_new(uVar23);
            sVar25 = (long)pvStack_710 - (long)local_718;
          }
          local_470.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = pcVar18 + uVar23;
          local_470.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = pcVar18;
          if (pvStack_710 != local_718) {
            memmove(pcVar18,local_718,sVar25);
          }
          local_470.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = pcVar18 + sVar25;
          ParseResponse(this,&local_470);
          if (pcVar18 != (pointer)0x0) {
            operator_delete(pcVar18,uVar23);
          }
        }
        if (local_698 != pvStack_690) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_650,"CURL debug output: [",0x14);
          if (pvStack_690 != local_698) {
            std::ostream::write((char *)local_650,(long)local_698);
            std::ostream::flush();
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_650,"]",1);
          std::ios::widen((char)*(undefined8 *)((long)local_650 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x174,(char *)local_798._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
          std::ios_base::~ios_base(local_5e0);
        }
        curl_easy_getinfo(local_6e0,CURLINFO_RESPONSE_CODE,&local_658);
        local_759 = local_658 == 200;
        if (((bool)local_759) && (this->HasErrors == false)) {
          fclose(__stream);
LAB_002b22bb:
          curl_easy_cleanup(in_stack_fffffffffffff858);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_798,"   Uploaded: ",&local_738);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_650,(char *)local_798._0_8_,local_798._8_8_);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1d4,(char *)local_798._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
          std::ios_base::~ios_base(local_5e0);
          bVar7 = true;
        }
        else {
          local_650 = (undefined1  [8])&local_640;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_650,"RetryDelay","");
          psVar19 = (string *)
                    cmCTestGenericHandler::GetOption
                              (&this->super_cmCTestGenericHandler,(string *)local_650);
          if (psVar19 == (string *)0x0) {
            psVar19 = &cmValue::Empty_abi_cxx11_;
          }
          local_798._0_8_ = local_798 + 0x10;
          pcVar3 = (psVar19->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_798,pcVar3,pcVar3 + psVar19->_M_string_length);
          if (local_650 != (undefined1  [8])&local_640) {
            operator_delete((void *)local_650,local_640._M_allocated_capacity + 1);
          }
          local_650 = (undefined1  [8])&local_640;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_650,"RetryCount","");
          psVar19 = (string *)
                    cmCTestGenericHandler::GetOption
                              (&this->super_cmCTestGenericHandler,(string *)local_650);
          if (psVar19 == (string *)0x0) {
            psVar19 = &cmValue::Empty_abi_cxx11_;
          }
          local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
          pcVar3 = (psVar19->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_700,pcVar3,pcVar3 + psVar19->_M_string_length);
          if (local_650 != (undefined1  [8])&local_640) {
            operator_delete((void *)local_650,local_640._M_allocated_capacity + 1);
          }
          if (local_798._8_8_ == 0) {
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_758,"CTestSubmitRetryDelay","");
            cmCTest::GetCTestConfiguration((string *)local_650,pcVar2,&local_758);
            auVar6 = local_650;
            iVar9 = atoi((char *)local_650);
            if (auVar6 != (undefined1  [8])&local_640) {
              operator_delete((void *)auVar6,local_640._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_758._M_dataplus._M_p != &local_758.field_2) {
              operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            iVar9 = atoi((char *)local_798._0_8_);
          }
          if (local_700._M_string_length == 0) {
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_758,"CTestSubmitRetryCount","");
            cmCTest::GetCTestConfiguration((string *)local_650,pcVar2,&local_758);
            auVar6 = local_650;
            iVar10 = atoi((char *)local_650);
            if (auVar6 != (undefined1  [8])&local_640) {
              operator_delete((void *)auVar6,local_640._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_758._M_dataplus._M_p != &local_758.field_2) {
              operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            iVar10 = atoi(local_700._M_dataplus._M_p);
          }
          if (0 < iVar10) {
            local_490 = (double)iVar9;
            local_498 = local_490 * 1000000000.0;
            iVar9 = 0;
            do {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_650,"   Submit failed, waiting ",0x1a);
              poVar11 = std::ostream::_M_insert<double>(local_490);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," seconds...\n",0xc);
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                           ,399,local_758._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet
                          );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_758._M_dataplus._M_p != &local_758.field_2) {
                operator_delete(local_758._M_dataplus._M_p,
                                local_758.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
              std::ios_base::~ios_base(local_5e0);
              lVar14 = std::chrono::_V2::steady_clock::now();
              local_660 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((double)lVar14 + local_498);
              while (lVar14 = std::chrono::_V2::steady_clock::now(),
                    (double)lVar14 < (double)local_660) {
                cmsys::SystemTools::Delay(100);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_650,"   Retry submission: Attempt ",0x1d);
              iVar9 = iVar9 + 1;
              poVar11 = (ostream *)std::ostream::operator<<(local_650,iVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," of ",4);
              plVar13 = (long *)std::ostream::operator<<(poVar11,iVar10);
              std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
              std::ostream::put((char)plVar13);
              std::ostream::flush();
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                           ,0x199,local_758._M_dataplus._M_p,
                           (this->super_cmCTestGenericHandler).Quiet);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_758._M_dataplus._M_p != &local_758.field_2) {
                operator_delete(local_758._M_dataplus._M_p,
                                local_758.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
              std::ios_base::~ios_base(local_5e0);
              fclose(__stream);
              __stream = (FILE *)cmsys::SystemTools::Fopen(&local_738,"rb");
              curl_easy_setopt(local_6e0,CURLOPT_READDATA,__stream);
              if (pvStack_710 != local_718) {
                pvStack_710 = local_718;
              }
              if (pvStack_690 != local_698) {
                pvStack_690 = local_698;
              }
              this->HasErrors = false;
              curl_easy_perform(local_6e0);
              if (local_718 != pvStack_710) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_650,"CURL output: [",0xe);
                if (pvStack_710 != local_718) {
                  std::ostream::write((char *)local_650,(long)local_718);
                  std::ostream::flush();
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_650,"]",1);
                cVar5 = (char)(ostream *)local_650;
                std::ios::widen((char)*(undefined8 *)((long)local_650 + -0x18) + cVar5);
                std::ostream::put(cVar5);
                std::ostream::flush();
                pcVar2 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar2,0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                             ,0x1aa,local_758._M_dataplus._M_p,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_758._M_dataplus._M_p != &local_758.field_2) {
                  operator_delete(local_758._M_dataplus._M_p,
                                  local_758.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
                std::ios_base::~ios_base(local_5e0);
                uVar23 = (long)pvStack_710 - (long)local_718;
                if (uVar23 == 0) {
                  pcVar18 = (pointer)0x0;
                  sVar25 = 0;
                }
                else {
                  if ((long)uVar23 < 0) {
                    std::__throw_bad_alloc();
                  }
                  pcVar18 = (pointer)operator_new(uVar23);
                  sVar25 = (long)pvStack_710 - (long)local_718;
                }
                local_488.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = pcVar18 + uVar23;
                local_488.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start = pcVar18;
                if (pvStack_710 != local_718) {
                  memmove(pcVar18,local_718,sVar25);
                }
                local_488.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish = pcVar18 + sVar25;
                ParseResponse(this,&local_488);
                if (pcVar18 != (pointer)0x0) {
                  operator_delete(pcVar18,uVar23);
                }
              }
              curl_easy_getinfo(local_6e0,CURLINFO_RESPONSE_CODE,&local_658);
              if ((local_658 == 200) && (this->HasErrors != true)) {
                local_759 = '\x01';
                break;
              }
            } while (iVar9 != iVar10);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_700._M_dataplus._M_p != &local_700.field_2) {
            operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          fclose(__stream);
          if (local_759 != '\0') goto LAB_002b22bb;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_650,"   Error when uploading file: ",0x1e);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_650,local_738._M_dataplus._M_p,
                               local_738._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1ba,(char *)local_798._0_8_,false);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
          std::ios_base::~ios_base(local_5e0);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_650,"   Error message was: ",0x16);
          sVar25 = strlen(local_438);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_650,local_438,sVar25);
          cVar5 = (char)(ostringstream *)local_650;
          std::ios::widen((char)*(undefined8 *)((long)local_650 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1bc,(char *)local_798._0_8_,false);
          if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
            operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
          std::ios_base::~ios_base(local_5e0);
          poVar11 = this->LogFile;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"   Error when uploading file: ",0x1e);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_738._M_dataplus._M_p,local_738._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          poVar11 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   Error message was: ",0x16);
          sVar25 = strlen(local_438);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_438,sVar25);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          if (local_718 != pvStack_710) {
            poVar11 = this->LogFile;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"   Curl output was: ",0x14);
            if (pvStack_710 != local_718) {
              std::ostream::write((char *)poVar11,(long)local_718);
              std::ostream::flush();
            }
            std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_650);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_650,"CURL output: [",0xe);
            if (pvStack_710 != local_718) {
              std::ostream::write((char *)local_650,(long)local_718);
              std::ostream::flush();
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_650,"]",1);
            std::ios::widen((char)*(undefined8 *)((long)local_650 + -0x18) + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x1c9,(char *)local_798._0_8_,false);
            if ((undefined1 *)local_798._0_8_ != local_798 + 0x10) {
              operator_delete((void *)local_798._0_8_,(ulong)(local_798._16_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_650);
            std::ios_base::~ios_base(local_5e0);
          }
          curl_easy_cleanup(in_stack_fffffffffffff858);
          curl_slist_free_all(local_6d0);
          curl_global_cleanup();
          bVar7 = false;
        }
        if (local_698 != (void *)0x0) {
          operator_delete(local_698,local_688 - (long)local_698);
        }
        if (local_718 != (void *)0x0) {
          operator_delete(local_718,local_708 - (long)local_718);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
          operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_dataplus._M_p != &local_680.field_2) {
          operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_dataplus._M_p != &local_738.field_2) {
          operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
        }
        if (!bVar7) {
          return false;
        }
      }
      local_6d8 = local_6d8 + 1;
    } while (local_6d8 != local_4a0);
  }
  curl_slist_free_all(local_6d0);
  curl_global_cleanup();
  return true;
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  cmCTestCurlOpts curlOpts(this->CTest);
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (curlOpts.TLSVersionOpt) {
        cm::optional<std::string> tlsVersionStr =
          cmCurlPrintTLSVersion(*curlOpts.TLSVersionOpt);
        cmCTestOptionalLog(
          this->CTest, HANDLER_VERBOSE_OUTPUT,
          "  Set CURLOPT_SSLVERSION to "
            << (tlsVersionStr ? *tlsVersionStr : "unknown value") << "\n",
          this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSLVERSION, *curlOpts.TLSVersionOpt);
      }
      if (curlOpts.TLSVerifyOpt) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to "
                             << (*curlOpts.TLSVerifyOpt ? "on" : "off")
                             << "\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER,
                         *curlOpts.TLSVerifyOpt ? 1 : 0);
      }
      if (curlOpts.VerifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      auto submitInactivityTimeout = this->GetSubmitInactivityTimeout();
      if (submitInactivityTimeout != 0) {
        ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                           submitInactivityTimeout);
      }

      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = cmStrCat(localprefix, "/", file);
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as =
        cmStrCat(url, ((url.find('?') == std::string::npos) ? '?' : '&'),
                 "FileName=", ofile);

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          cmValue subproject = cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(*subproject);
          }
        }
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      upload_as += "&MD5=";

      if (this->GetOption("InternalTest").IsOn()) {
        upload_as += "ffffffffffffffffffffffffffffffff";
      } else {
        cmCryptoHash hasher(cmCryptoHash::AlgoMD5);
        upload_as += hasher.HashFile(local_file);
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // follow redirects
      ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1);

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      long response_code;
      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response_code);
      bool successful_submission = response_code == 200;

      if (!successful_submission || this->HasErrors) {
        std::string retryDelay = *this->GetOption("RetryDelay");
        std::string retryCount = *this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response_code);
          if (response_code == 200 && !this->HasErrors) {
            successful_submission = true;
            break;
          }
        }
      }

      fclose(ftpfile);
      if (!successful_submission) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}